

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::
         ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform,_2UL>
         ::Construct(DB *db,LIST *params)

{
  IfcCartesianTransformationOperator3DnonUniform *in;
  
  in = (IfcCartesianTransformationOperator3DnonUniform *)operator_new(0xd0);
  *(undefined ***)&in->field_0xb8 = &PTR__Object_007e6a70;
  *(undefined8 *)&in->field_0xc0 = 0;
  *(char **)&in->field_0xc8 = "IfcCartesianTransformationOperator3DnonUniform";
  Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D::
  IfcCartesianTransformationOperator3D
            ((IfcCartesianTransformationOperator3D *)in,&PTR_construction_vtable_24__00855710);
  *(undefined8 *)&(in->super_IfcCartesianTransformationOperator3D).field_0x90 = 0;
  (in->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCartesianTransformationOperator3DnonUniform_00855630;
  *(undefined ***)&in->field_0xb8 = &PTR__IfcCartesianTransformationOperator3DnonUniform_008556f8;
  *(undefined ***)
   &(in->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcCartesianTransformationOperator3DnonUniform_00855658;
  *(undefined ***)
   &(in->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcCartesianTransformationOperator3DnonUniform_00855680;
  *(undefined ***)
   &(in->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    field_0x68 = &PTR__IfcCartesianTransformationOperator3DnonUniform_008556a8;
  *(undefined ***)&(in->super_IfcCartesianTransformationOperator3D).field_0x88 =
       &PTR__IfcCartesianTransformationOperator3DnonUniform_008556d0;
  in->field_0xa0 = 0;
  (in->Scale3).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>(db,params,in)
  ;
  return (Object *)
         ((long)&(in->super_IfcCartesianTransformationOperator3D).
                 super_IfcCartesianTransformationOperator.super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcCartesianTransformationOperator3D).
               super_IfcCartesianTransformationOperator.super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }